

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubBoard.cpp
# Opt level: O1

Chunk * __thiscall SubBoard::accessChunk(SubBoard *this,repr coords)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  source_loc loc;
  logger *this_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false> _Var3;
  ChunkDrawable *this_01;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  string_view_t fmt;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>,_bool>
  pVar7;
  pair<int,_int> local_60;
  repr local_58;
  LodRenderer *local_50;
  pair<int,_int> local_48;
  LodRenderer **ppLStack_40;
  undefined8 local_38;
  
  uVar1 = (this->chunks_)._M_h._M_bucket_count;
  uVar4 = coords % uVar1;
  p_Var5 = (this->chunks_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)coords)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)coords)) goto LAB_00175d6b;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00175d6b:
  if (p_Var6 == (__node_base_ptr)0x0) {
    _Var3._M_cur = (__node_type *)0x0;
  }
  else {
    _Var3._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (_Var3._M_cur == (__node_type *)0x0) {
    local_60 = (pair<int,_int>)(coords ^ 0x8000000080000000);
    local_58 = coords;
    this_00 = spdlog::default_logger_raw();
    local_48.first = 0;
    local_48.second = 0;
    ppLStack_40 = (LodRenderer **)0x0;
    local_38 = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x24;
    fmt.data_ = "SubBoard allocating new chunk at {}.";
    spdlog::logger::log_<std::pair<int,int>>(this_00,loc,warn,fmt,&local_60);
    local_50 = &this->super_LodRenderer;
    ppLStack_40 = &local_50;
    local_60 = (pair<int,_int>)&local_58;
    local_48 = (pair<int,_int>)&local_58;
    pVar7 = std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,Chunk>,std::allocator<std::pair<unsigned_long_const,Chunk>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<LodRenderer*&&,unsigned_long&>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Chunk>,std::allocator<std::pair<unsigned_long_const,Chunk>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->chunks_,&std::piecewise_construct,&local_60,&local_48);
    _Var3._M_cur = (__node_type *)
                   pVar7.first.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur;
    this_01 = FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
                        (&this->chunkDrawables_,&local_58);
    ChunkDrawable::setChunk(this_01,(Chunk *)((long)_Var3._M_cur + 0x10));
  }
  return (Chunk *)((long)&((_Var3._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_Chunk>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_Chunk>_>.
                          _M_storage._M_storage + 8);
}

Assistant:

Chunk& SubBoard::accessChunk(ChunkCoords::repr coords) {
    auto chunk = chunks_.find(coords);
    if (chunk != chunks_.end()) {
        return chunk->second;
    }

    spdlog::warn("SubBoard allocating new chunk at {}.", ChunkCoords::toPair(coords));
    chunk = chunks_.emplace(std::piecewise_construct, std::forward_as_tuple(coords), std::forward_as_tuple(static_cast<LodRenderer*>(this), coords)).first;
    chunkDrawables_[coords].setChunk(&chunk->second);
    return chunk->second;
}